

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::SetUtxoData(Psbt *this,UtxoData *utxo,Transaction *transaction)

{
  Script *in_RDI;
  Script redeem_script;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  undefined1 in_stack_0000046f;
  Script *in_stack_00000470;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_00000478;
  TxOut *in_stack_00000480;
  OutPoint *in_stack_00000488;
  UtxoData *in_stack_00000490;
  NetType *in_stack_000004a0;
  Script *in_stack_ffffffffffffff50;
  Transaction *in_stack_ffffffffffffff60;
  OutPoint *in_stack_ffffffffffffff68;
  Psbt *in_stack_ffffffffffffff70;
  OutPoint local_40;
  
  cfd::core::OutPoint::OutPoint(&local_40);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x3c4830);
  cfd::core::Script::Script((Script *)&stack0xffffffffffffff70);
  ConvertFromUtxoData(in_stack_00000490,in_stack_00000488,in_stack_00000480,in_stack_00000478,
                      in_stack_00000470,(bool)in_stack_0000046f,in_stack_000004a0);
  SetTxInUtxo(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_RDI,
              (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
              in_stack_ffffffffffffff50);
  core::Script::~Script(in_stack_ffffffffffffff50);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_ffffffffffffff60);
  core::OutPoint::~OutPoint((OutPoint *)0x3c48af);
  return;
}

Assistant:

void Psbt::SetUtxoData(const UtxoData& utxo, const Transaction& transaction) {
  OutPoint outpoint;
  std::vector<KeyData> key_list;
  Script redeem_script;
  ConvertFromUtxoData(
      utxo, &outpoint, nullptr, &key_list, &redeem_script, true);

  SetTxInUtxo(outpoint, transaction, redeem_script, key_list);
}